

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-entry-combiner.c
# Opt level: O3

void smallest_combine_accum(int v,int a,ui_entry_combiner_state *st)

{
  if (v != 0x7ffffffe) {
    if (v == 0x7fffffff) {
      if (st->accum != 0x7ffffffe) goto LAB_001c4b5f;
    }
    else if (st->accum < 0x7ffffffe && st->accum <= v) goto LAB_001c4b5f;
    st->accum = v;
  }
LAB_001c4b5f:
  if (a != 0x7ffffffe) {
    if (a == 0x7fffffff) {
      if (st->accum_aux != 0x7ffffffe) {
        return;
      }
    }
    else if (st->accum_aux < 0x7ffffffe && st->accum_aux <= a) {
      return;
    }
    st->accum_aux = a;
  }
  return;
}

Assistant:

static void smallest_combine_accum_help(int x, int *accum)
{
	if (x == UI_ENTRY_VALUE_NOT_PRESENT) {
		return;
	}
	if (x == UI_ENTRY_UNKNOWN_VALUE) {
		if (*accum == UI_ENTRY_VALUE_NOT_PRESENT) {
			*accum = UI_ENTRY_UNKNOWN_VALUE;
		}
		return;
	}
	if (*accum == UI_ENTRY_UNKNOWN_VALUE ||
		*accum == UI_ENTRY_VALUE_NOT_PRESENT || *accum > x) {
		*accum = x;
	}
}